

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O2

void __thiscall
SleighArchitecture::SleighArchitecture
          (SleighArchitecture *this,string *fname,string *targ,ostream *estream)

{
  Architecture::Architecture(&this->super_Architecture);
  (this->super_Architecture).super_AddrSpaceManager._vptr_AddrSpaceManager =
       (_func_int **)&PTR__SleighArchitecture_003ff398;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  (this->target)._M_dataplus._M_p = (pointer)&(this->target).field_2;
  (this->target)._M_string_length = 0;
  (this->target).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->filename);
  std::__cxx11::string::_M_assign((string *)&this->target);
  this->errorstream = estream;
  return;
}

Assistant:

SleighArchitecture::SleighArchitecture(const string &fname,const string &targ,ostream *estream)
  : Architecture()

{
  filename = fname;
  target = targ;
  errorstream = estream;
}